

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_tricks_test.cpp
# Opt level: O1

void __thiscall SET_TRICKS_Works_Test::~SET_TRICKS_Works_Test(SET_TRICKS_Works_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(SET_TRICKS, Works) {
    srand(123);
    set<ll> s;
    populateSet(s, 1000);
    vector<ll> v;
    for(auto k : s) v.push_back(k);

    rep(i,0,1000) {
        ll k = rand();
        ll best = -INF;
        ll bestStrict = -INF;
        rep(j,0,v.size()) {
            if(v[j] < k) {
                best = v[j];
                bestStrict = v[j];
            } else if(v[j] == k) {
                best = v[j];
            } else {
                break;
            }
        }
        EXPECT_EQ(best, closestLower(s, k));
        EXPECT_EQ(bestStrict, closestLowerStrict(s, k));
    }
}